

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O0

string * __thiscall
soul::Structure::addMemberWithUniqueName
          (string *__return_storage_ptr__,Structure *this,Type *type,string *memberName)

{
  ulong uVar1;
  string local_a8;
  Type local_88;
  Structure *local_70 [3];
  undefined1 local_52;
  allocator<char> local_51;
  string local_50 [39];
  undefined1 local_29;
  string *local_28;
  string *memberName_local;
  Type *type_local;
  Structure *this_local;
  string *newName;
  
  local_29 = 0;
  local_28 = memberName;
  memberName_local = (string *)type;
  type_local = (Type *)this;
  this_local = (Structure *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  local_52 = 0;
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(local_50,(string *)local_28);
  }
  else {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string<std::allocator<char>>(local_50,"temp",&local_51);
  }
  local_70[0] = this;
  addSuffixToMakeUnique<soul::Structure::addMemberWithUniqueName(soul::Type,std::__cxx11::string_const&)::__0>
            (__return_storage_ptr__,(soul *)local_50,(string *)local_70,
             (anon_class_8_1_8991fb9c *)memberName);
  std::__cxx11::string::~string(local_50);
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator(&local_51);
  }
  Type::Type(&local_88,type);
  std::__cxx11::string::string((string *)&local_a8,(string *)__return_storage_ptr__);
  addMember(this,&local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  Type::~Type(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string Structure::addMemberWithUniqueName (Type type, const std::string& memberName)
{
    auto newName = addSuffixToMakeUnique (memberName.empty() ? "temp" : memberName,
                                          [this] (const std::string& nm) { return hasMemberWithName (nm); });
    addMember (std::move (type), newName);
    return newName;
}